

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O1

void anon_unknown.dwarf_151ef2::fillPixels1(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  short sVar1;
  Rgba *pRVar2;
  ushort uVar3;
  unsigned_short uVar4;
  uint uVar5;
  long lVar6;
  int y;
  ulong uVar7;
  int x;
  ulong uVar8;
  float fVar9;
  float fVar10;
  uif x_1;
  long local_40;
  
  local_40 = 0;
  uVar7 = 0;
  do {
    fVar9 = (float)((uint)uVar7 & 1);
    uVar8 = 0;
    do {
      fVar10 = (float)((uint)uVar8 & 1);
      lVar6 = pixels->_sizeY;
      pRVar2 = pixels->_data;
      if ((uVar8 & 1) == 0) {
        uVar4 = (unsigned_short)((uint)fVar10 >> 0x10);
      }
      else {
        sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar10 >> 0x17) * 2);
        if (sVar1 == 0) {
          uVar4 = half::convert((int)fVar10);
        }
        else {
          uVar4 = sVar1 + (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                                  (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      uVar5 = (uint)uVar8 + (uint)uVar7;
      fVar10 = (float)(uVar5 & 1);
      lVar6 = lVar6 * local_40;
      *(unsigned_short *)((long)&pRVar2[uVar8].r._h + lVar6) = uVar4;
      if ((uVar5 & 1) == 0) {
        uVar4 = (unsigned_short)((uint)fVar10 >> 0x10);
      }
      else {
        sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar10 >> 0x17) * 2);
        if (sVar1 == 0) {
          uVar4 = half::convert((int)fVar10);
        }
        else {
          uVar4 = sVar1 + (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                                  (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      *(unsigned_short *)((long)&pRVar2[uVar8].g._h + lVar6) = uVar4;
      uVar3 = (ushort)((uint)fVar9 >> 0x10);
      if ((uVar7 & 1) != 0) {
        sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
        if (sVar1 == 0) {
          uVar3 = half::convert((int)fVar9);
        }
        else {
          uVar3 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                  (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      *(ushort *)((long)&pRVar2[uVar8].b._h + lVar6) = uVar3;
      fVar10 = (*(float *)((long)&half::_toFloat +
                          (ulong)*(unsigned_short *)((long)&pRVar2[uVar8].r._h + lVar6) * 4) +
                *(float *)((long)&half::_toFloat + (ulong)uVar3 * 4) +
               *(float *)((long)&half::_toFloat +
                         (ulong)*(unsigned_short *)((long)&pRVar2[uVar8].g._h + lVar6) * 4)) / 3.0;
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar10 >> 0x17) * 2);
        if (sVar1 == 0) {
          uVar4 = half::convert((int)fVar10);
        }
        else {
          uVar4 = sVar1 + (short)(((uint)fVar10 & 0x7fffff) + 0xfff +
                                  (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd);
        }
      }
      else {
        uVar4 = (unsigned_short)((uint)fVar10 >> 0x10);
      }
      *(unsigned_short *)((long)&pRVar2[uVar8].a._h + lVar6) = uVar4;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x77);
    uVar7 = uVar7 + 1;
    local_40 = local_40 + 8;
  } while (uVar7 != 0xed);
  return;
}

Assistant:

void
fillPixels1 (Array2D<Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = (x & 1);
	    p.g = ((x + y) & 1);
	    p.b = (y & 1);
	    p.a = (p.r + p.b + p.g) / 3.0;
	}
    }
}